

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void log_secret(ptls_t *tls,char *type,ptls_iovec_t secret)

{
  st_ptls_log_event_t *psVar1;
  _func_void_st_ptls_log_event_t_ptr_ptls_t_ptr_char_ptr_char_ptr_varargs *p_Var2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  size_t l;
  void *get_sni_arg;
  char *value_;
  int includes_appdata;
  char hexbuf [129];
  
  uVar3 = ptls_log_point_maybe_active(&log_secret::logpoint);
  if (uVar3 != 0) {
    uVar4 = ptls_log_conn_maybe_active(&tls->log_state,(_func_char_ptr_void_ptr *)tls,get_sni_arg);
    if ((uVar4 & uVar3) != 0) {
      includes_appdata = 0;
      do {
        ptls_log__do_write_start(&log_secret::logpoint,1);
        ptls_log__do_push_element_unsigned64(",\"tls\":",7,(uint64_t)tls);
        l = strlen(type);
        ptls_log__do_push_element_safestr(",\"label\":",9,type,l);
        iVar5 = ptls_log__do_write_end
                          (&log_secret::logpoint,&tls->log_state,ptls_get_server_name,tls,
                           includes_appdata);
        includes_appdata = 1;
      } while (iVar5 != 0);
    }
  }
  psVar1 = tls->ctx->log_event;
  if (psVar1 != (st_ptls_log_event_t *)0x0) {
    p_Var2 = psVar1->cb;
    ptls_hexdump(hexbuf,secret.base,secret.len);
    (*p_Var2)(psVar1,tls,type,"%s",hexbuf);
  }
  return;
}

Assistant:

static void log_secret(ptls_t *tls, const char *type, ptls_iovec_t secret)
{
    char hexbuf[PTLS_MAX_DIGEST_SIZE * 2 + 1];

    PTLS_PROBE(NEW_SECRET, tls, type, ptls_hexdump(hexbuf, secret.base, secret.len));
    PTLS_LOG_CONN(new_secret, tls, { PTLS_LOG_ELEMENT_SAFESTR(label, type); });

    if (tls->ctx->log_event != NULL)
        tls->ctx->log_event->cb(tls->ctx->log_event, tls, type, "%s", ptls_hexdump(hexbuf, secret.base, secret.len));
}